

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

void __thiscall StringKey::dump(StringKey *this)

{
  uint uVar1;
  char *pcVar2;
  ostream *poVar3;
  ulong uVar4;
  void *pvVar5;
  StringKey *in_RDI;
  string str;
  allocator local_29;
  string local_28 [40];
  
  pcVar2 = value(in_RDI);
  uVar1 = length(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,pcVar2,(ulong)uVar1,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  poVar3 = std::operator<<((ostream *)&std::cout,"Length: ");
  uVar4 = std::__cxx11::string::length();
  pvVar5 = (void *)std::ostream::operator<<(poVar3,uVar4);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Value: ");
  poVar3 = std::operator<<(poVar3,local_28);
  pvVar5 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void StringKey::dump() const
{
	std::string str(value(), length());
	std::cout
		<< "Length: " << str.length() << std::endl
		<< "Value: " << str << std::endl
		<< std::endl;
}